

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ScriptWitness * __thiscall
cfd::core::ConfidentialTransaction::AddPeginWitnessStack
          (ScriptWitness *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  void *pvVar1;
  wally_tx_witness_stack *pwVar2;
  pointer puVar3;
  pointer pCVar4;
  wally_tx_witness_stack *pwVar5;
  int iVar6;
  CfdException *this_00;
  pointer puVar7;
  ulong uVar8;
  int ret;
  allocator local_89;
  wally_tx_witness_stack *stack_pointer;
  undefined1 local_80 [32];
  string function_name;
  
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x6a8,"AddPeginWitnessStack");
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  uVar8 = (ulong)tx_in_index;
  if (uVar8 < *(ulong *)((long)pvVar1 + 0x10)) {
    ret = 0;
    stack_pointer = (wally_tx_witness_stack *)0x0;
    ::std::__cxx11::string::string
              ((string *)&function_name,"wally_tx_witness_stack_init_alloc",(allocator *)local_80);
    pwVar2 = *(wally_tx_witness_stack **)(*(long *)((long)pvVar1 + 8) + 200 + uVar8 * 0xd0);
    pwVar5 = pwVar2;
    if ((pwVar2 == (wally_tx_witness_stack *)0x0) &&
       (ret = wally_tx_witness_stack_init_alloc(1,&stack_pointer), pwVar5 = stack_pointer, ret != 0)
       ) {
LAB_00202f21:
      local_80._0_8_ = "cfdcore_elements_transaction.cpp";
      local_80._8_4_ = 0x6d5;
      local_80._16_8_ = "AddPeginWitnessStack";
      logger::warn<std::__cxx11::string&,int&>
                ((CfdSourceLocation *)local_80,"{} NG[{}].",&function_name,&ret);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_80,"witness stack error.",&local_89);
      CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_80);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    stack_pointer = pwVar5;
    ::std::__cxx11::string::assign((char *)&function_name);
    puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish + -(long)puVar3;
    if (puVar7 == (pointer)0x0) {
      puVar7 = (pointer)0x0;
      puVar3 = (pointer)0x0;
    }
    iVar6 = wally_tx_witness_stack_add(stack_pointer,puVar3,puVar7);
    ret = iVar6;
    if ((pwVar2 == (wally_tx_witness_stack *)0x0) && (iVar6 == 0)) {
      *(wally_tx_witness_stack **)(*(long *)((long)pvVar1 + 8) + 200 + uVar8 * 0xd0) = stack_pointer
      ;
      stack_pointer = (wally_tx_witness_stack *)0x0;
    }
    else {
      if (stack_pointer != (wally_tx_witness_stack *)0x0 && pwVar2 == (wally_tx_witness_stack *)0x0)
      {
        wally_tx_witness_stack_free();
      }
      if (iVar6 != 0) goto LAB_00202f21;
    }
    ::std::__cxx11::string::~string((string *)&function_name);
  }
  SetElementsTxState(this);
  pCVar4 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ByteData::ByteData((ByteData *)local_80,data);
  ConfidentialTxIn::AddPeginWitnessStack
            ((ScriptWitness *)&function_name,pCVar4 + uVar8,(ByteData *)local_80);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  ScriptWitness::ScriptWitness(__return_storage_ptr__,(ScriptWitness *)&function_name);
  ScriptWitness::~ScriptWitness((ScriptWitness *)&function_name);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness ConfidentialTransaction::AddPeginWitnessStack(
    uint32_t tx_in_index, const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_OK;
    bool is_alloc = false;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally_tx_witness_stack_init_alloc";
    if (tx_pointer->inputs[tx_in_index].pegin_witness == NULL) {
      is_alloc = true;
      ret = wally_tx_witness_stack_init_alloc(1, &stack_pointer);
    } else {
      stack_pointer = tx_pointer->inputs[tx_in_index].pegin_witness;
    }

    if (ret == WALLY_OK) {
      try {
        // append witness stack
        function_name = "wally_tx_witness_stack_add";
        if (data.empty()) {
          ret = wally_tx_witness_stack_add(stack_pointer, NULL, 0);
        } else {
          ret = wally_tx_witness_stack_add(
              stack_pointer, data.data(), data.size());
        }

        // append tx input
        if (is_alloc && (ret == WALLY_OK)) {
          tx_pointer->inputs[tx_in_index].pegin_witness = stack_pointer;
          stack_pointer = nullptr;
        }
      } catch (...) {
        // internal error.
        warn(CFD_LOG_SOURCE, "system error.");
        ret = WALLY_ERROR;
      }

      if (is_alloc && stack_pointer) {
        wally_tx_witness_stack_free(stack_pointer);
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack error.");
    }
  }
  SetElementsTxState();

  const ScriptWitness &witness =
      vin_[tx_in_index].AddPeginWitnessStack(ByteData(data));
  return witness;
}